

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O0

int mov_mem_imm(em8051 *aCPU)

{
  uint uVar1;
  int address;
  em8051 *aCPU_local;
  
  uVar1 = (uint)aCPU->mCodeMem[(int)(aCPU->mPC + 1U & aCPU->mCodeMemSize - 1U)];
  if (uVar1 < 0x80) {
    aCPU->mLowerData[(int)uVar1] = aCPU->mCodeMem[(int)(aCPU->mPC + 2U & aCPU->mCodeMemSize - 1U)];
  }
  else {
    aCPU->mSFR[(int)(uVar1 - 0x80)] =
         aCPU->mCodeMem[(int)(aCPU->mPC + 2U & aCPU->mCodeMemSize - 1U)];
    if (aCPU->sfrwrite != (em8051sfrwrite)0x0) {
      (*aCPU->sfrwrite)(aCPU,uVar1);
    }
  }
  aCPU->mPC = aCPU->mPC + 3;
  return 1;
}

Assistant:

static int mov_mem_imm(struct em8051 *aCPU)
{
    int address = OPERAND1;
    if (address > 0x7f)
    {
        aCPU->mSFR[address - 0x80] = OPERAND2;
        if (aCPU->sfrwrite)
            aCPU->sfrwrite(aCPU, address);
    }
    else
    {
        aCPU->mLowerData[address] = OPERAND2;
    }

    PC += 3;
    return 1;
}